

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2-client.c
# Opt level: O2

void ssh2_rportfwd_globreq_response(ssh2_connection_state *s,PktIn *pktin,void *ctx)

{
  LogContext *ctx_00;
  char *pcVar1;
  void *pvVar2;
  
  ctx_00 = (s->ppl).logctx;
  if (pktin->type == 0x51) {
    pcVar1 = dupprintf("Remote port forwarding from %s enabled",*(undefined8 *)((long)ctx + 0x20));
    logevent_and_free(ctx_00,pcVar1);
    return;
  }
  pcVar1 = dupprintf("Remote port forwarding from %s refused",*(undefined8 *)((long)ctx + 0x20));
  logevent_and_free(ctx_00,pcVar1);
  pvVar2 = del234(s->rportfwds,ctx);
  if (pvVar2 == ctx) {
    portfwdmgr_close(s->portfwdmgr,*(PortFwdRecord **)((long)ctx + 0x30));
    free_rportfwd((ssh_rportfwd *)ctx);
    return;
  }
  __assert_fail("realpf == rpf",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2-client.c"
                ,0xe1,
                "void ssh2_rportfwd_globreq_response(struct ssh2_connection_state *, PktIn *, void *)"
               );
}

Assistant:

static void ssh2_rportfwd_globreq_response(struct ssh2_connection_state *s,
                                           PktIn *pktin, void *ctx)
{
    PacketProtocolLayer *ppl = &s->ppl; /* for ppl_logevent */
    struct ssh_rportfwd *rpf = (struct ssh_rportfwd *)ctx;

    if (pktin->type == SSH2_MSG_REQUEST_SUCCESS) {
        ppl_logevent("Remote port forwarding from %s enabled",
                     rpf->log_description);
    } else {
        ppl_logevent("Remote port forwarding from %s refused",
                     rpf->log_description);

        struct ssh_rportfwd *realpf = del234(s->rportfwds, rpf);
        assert(realpf == rpf);
        portfwdmgr_close(s->portfwdmgr, rpf->pfr);
        free_rportfwd(rpf);
    }
}